

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteEnumValueDocComment
               (Printer *printer,EnumValueDescriptor *value,Options *options)

{
  Options *printer_00;
  EnumValueDescriptor *pEVar1;
  char *pcVar2;
  undefined1 in_R8B;
  string_view input;
  string local_110;
  string local_f0;
  undefined1 local_d0 [16];
  string local_c0;
  string_view local_a0 [2];
  Options local_80;
  string_view local_30;
  Options *local_20;
  Options *options_local;
  EnumValueDescriptor *value_local;
  Printer *printer_local;
  
  local_20 = options;
  options_local = (Options *)value;
  value_local = (EnumValueDescriptor *)printer;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"/**\n");
  io::Printer::Print<>(printer,local_30);
  pEVar1 = value_local;
  printer_00 = options_local;
  Options::Options(&local_80,options);
  pcVar2 = (char *)0x0;
  WriteDocCommentBody<google::protobuf::EnumValueDescriptor>
            ((java *)pEVar1,(Printer *)printer_00,(EnumValueDescriptor *)&local_80,(Options *)0x0,
             (bool)in_R8B);
  Options::~Options(&local_80);
  pEVar1 = value_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a0," * <code>$def$</code>\n */\n");
  EnumValueDescriptor::DebugString_abi_cxx11_(&local_110,(EnumValueDescriptor *)options_local);
  FirstLineOf(&local_f0,&local_110);
  local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
  input._M_len = local_d0._8_8_;
  input._M_str = pcVar2;
  EscapeJavadoc_abi_cxx11_(&local_c0,local_d0._0_8_,input);
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)pEVar1,local_a0[0],(char (*) [4])0xa32d63,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void WriteEnumValueDocComment(io::Printer* printer,
                              const EnumValueDescriptor* value,
                              const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, value, options, /* kdoc */ false);

  printer->Print(
      " * <code>$def$</code>\n"
      " */\n",
      "def", EscapeJavadoc(FirstLineOf(value->DebugString())));
}